

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDomainGetAllEntities
              (FmsDomain domain,FmsEntityType type,FmsIntType *ent_id_type,void **ents,
              FmsInt *num_ents)

{
  FmsInt *num_ents_local;
  void **ents_local;
  FmsIntType *ent_id_type_local;
  FmsEntityType type_local;
  FmsDomain domain_local;
  int local_4;
  
  if (domain == (FmsDomain)0x0) {
    local_4 = 1;
  }
  else if (type < FMS_NUM_ENTITY_TYPES) {
    if (ent_id_type != (FmsIntType *)0x0) {
      *ent_id_type = domain->side_ids_type[type];
    }
    if (ents != (void **)0x0) {
      *ents = domain->entities[type];
    }
    if (num_ents != (FmsInt *)0x0) {
      *num_ents = domain->num_entities[type];
    }
    local_4 = 0;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsDomainGetAllEntities(FmsDomain domain, FmsEntityType type,
                            FmsIntType *ent_id_type, const void **ents,
                            FmsInt *num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (ent_id_type) { *ent_id_type = domain->side_ids_type[type]; }
  if (ents) { *ents = domain->entities[type]; }
  if (num_ents) { *num_ents = domain->num_entities[type]; }
  return 0;
}